

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O2

void av1_calc_indices_dim2_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  int iVar8;
  ulong uVar9;
  int l;
  undefined1 (*pauVar10) [32];
  int j;
  undefined4 uVar11;
  long lVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  __m256i ind [2];
  __m256i cents [8];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [256];
  
  lVar7 = 0;
  uVar9 = 0;
  if (0 < k) {
    uVar9 = (ulong)(uint)k;
  }
  for (; uVar9 * 4 != lVar7; lVar7 = lVar7 + 4) {
    uVar11 = *(undefined4 *)((long)centroids + lVar7);
    lVar12 = lVar7 * 8;
    *(undefined4 *)(local_140 + lVar12) = uVar11;
    *(undefined4 *)(local_140 + lVar12 + 4) = uVar11;
    *(undefined4 *)(local_140 + lVar12 + 8) = uVar11;
    *(undefined4 *)(local_140 + lVar12 + 0xc) = uVar11;
    *(undefined4 *)(local_140 + lVar12 + 0x10) = uVar11;
    *(undefined4 *)(local_120 + lVar12 + -0xc) = uVar11;
    *(undefined4 *)(local_120 + lVar12 + -8) = uVar11;
    *(undefined4 *)(local_120 + lVar12 + -4) = uVar11;
  }
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  for (iVar8 = 0; iVar8 < n; iVar8 = iVar8 + 0x10) {
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      auVar1 = *(undefined1 (*) [32])data;
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      *(undefined1 (*) [32])(local_180 + lVar7 * 0x20) = auVar14._0_32_;
      auVar5 = vpsubw_avx2(auVar1,local_140);
      auVar5 = vpmaddwd_avx2(auVar5,auVar5);
      pauVar10 = (undefined1 (*) [32])local_120;
      for (lVar12 = 1; lVar12 < k; lVar12 = lVar12 + 1) {
        auVar6 = vpsubw_avx2(auVar1,*pauVar10);
        auVar4 = vpmaddwd_avx2(auVar6,auVar6);
        auVar6 = vpcmpgtd_avx2(auVar5,auVar4);
        auVar5 = vpminsd_avx2(auVar5,auVar4);
        uVar11 = (undefined4)lVar12;
        auVar15._4_4_ = uVar11;
        auVar15._0_4_ = uVar11;
        auVar15._8_4_ = uVar11;
        auVar15._12_4_ = uVar11;
        auVar15._16_4_ = uVar11;
        auVar15._20_4_ = uVar11;
        auVar15._24_4_ = uVar11;
        auVar15._28_4_ = uVar11;
        auVar4 = vpandn_avx2(auVar6,auVar14._0_32_);
        auVar6 = vpand_avx2(auVar6,auVar15);
        auVar6 = vpor_avx2(auVar4,auVar6);
        auVar14 = ZEXT3264(auVar6);
        *(undefined1 (*) [32])(local_180 + lVar7 * 0x20) = auVar6;
        pauVar10 = pauVar10 + 1;
      }
      if (total_dist != (int64_t *)0x0) {
        auVar1 = vpunpckldq_avx2(auVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar5 = vpunpckhdq_avx2(auVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar1 = vpaddq_avx2(auVar13._0_32_,auVar1);
        auVar1 = vpaddq_avx2(auVar1,auVar5);
        auVar13 = ZEXT3264(auVar1);
      }
      data = (int16_t *)((long)data + 0x20);
    }
    auVar1 = vpackusdw_avx2(local_180,local_160);
    auVar1 = vpackuswb_avx2(auVar1,auVar13._0_32_);
    auVar3 = vpunpckldq_avx(auVar1._0_16_,auVar1._16_16_);
    *(undefined1 (*) [16])indices = auVar3;
    indices = (uint8_t *)((long)indices + 0x10);
  }
  if (total_dist != (int64_t *)0x0) {
    auVar3 = vpaddq_avx(auVar13._0_16_,auVar13._16_16_);
    auVar2 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar2,auVar3);
    *total_dist = auVar3._0_8_;
  }
  return;
}

Assistant:

void av1_calc_indices_dim2_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  const __m256i permute = _mm256_set_epi32(0, 0, 0, 0, 5, 1, 4, 0);
  __m256i sum = _mm256_setzero_si256();
  __m256i ind[2];
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    const int16_t cx = centroids[2 * j], cy = centroids[2 * j + 1];
    cents[j] = _mm256_set_epi16(cy, cx, cy, cx, cy, cx, cy, cx, cy, cx, cy, cx,
                                cy, cx, cy, cx);
  }

  for (int i = 0; i < n; i += 16) {
    for (int l = 0; l < 2; ++l) {
      const __m256i in = _mm256_loadu_si256((__m256i *)data);
      ind[l] = _mm256_setzero_si256();
      // Compute the distance to the first centroid.
      __m256i d1 = _mm256_sub_epi16(in, cents[0]);
      __m256i dist_min = _mm256_madd_epi16(d1, d1);

      for (int j = 1; j < k; ++j) {
        // Compute the distance to the centroid.
        d1 = _mm256_sub_epi16(in, cents[j]);
        const __m256i dist = _mm256_madd_epi16(d1, d1);
        // Compare to the minimal one.
        const __m256i cmp = _mm256_cmpgt_epi32(dist_min, dist);
        dist_min = _mm256_min_epi32(dist_min, dist);
        const __m256i ind1 = _mm256_set1_epi32(j);
        ind[l] = _mm256_or_si256(_mm256_andnot_si256(cmp, ind[l]),
                                 _mm256_and_si256(cmp, ind1));
      }
      if (total_dist) {
        // Convert to 64 bit and add to sum.
        const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
        const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
        sum = _mm256_add_epi64(sum, dist1);
        sum = _mm256_add_epi64(sum, dist2);
      }
      data += 16;
    }
    // Cast to 8 bit and store.
    const __m256i d2 = _mm256_packus_epi32(ind[0], ind[1]);
    const __m256i d3 = _mm256_packus_epi16(d2, v_zero);
    const __m256i d4 = _mm256_permutevar8x32_epi32(d3, permute);
    const __m128i d5 = _mm256_extracti128_si256(d4, 0);
    _mm_storeu_si128((__m128i *)indices, d5);
    indices += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}